

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O1

bool __thiscall
ser::Serializer::RegisterField
          (Serializer *this,string *name,string *type,int bytesPerElement,int iSize,int jSize,
          int kSize,int lSize,int iMinusHalo,int iPlusHalo,int jMinusHalo,int jPlusHalo,
          int kMinusHalo,int kPlusHalo,int lMinusHalo,int lPlusHalo)

{
  pointer pcVar1;
  size_t __n;
  int iVar2;
  DataFieldInfo *other_00;
  ostream *poVar3;
  SerializationException *pSVar4;
  DataFieldInfo other;
  DataFieldInfo info;
  SerializationException exception_1;
  ostringstream errorstr;
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  DataFieldInfo local_340;
  undefined1 local_298 [8];
  _Alloc_hider local_290;
  undefined1 local_288 [16];
  string local_278 [16];
  char local_268 [16];
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  local_220;
  undefined1 *local_1f0;
  undefined1 local_1e0 [16];
  undefined **local_1d0;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostringstream local_1a8 [376];
  
  if ((((iSize < 1) || (jSize < 1)) || (kSize < 1)) || (lSize < 1)) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error: field ",0xd);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is registered with sizes: ",0x1b);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,jSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,kSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,lSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Sizes must be larger than 0 for all dimensions\n",0x2f);
    local_290._M_p = local_288 + 8;
    local_298 = (undefined1  [8])&PTR__SerializationException_0013c730;
    local_288._0_8_ = 0;
    local_288[8] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340.name_._M_dataplus._M_p != &local_340.name_.field_2) {
      operator_delete(local_340.name_._M_dataplus._M_p);
    }
    pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar4,(SerializationException *)local_298);
    __cxa_throw(pSVar4,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  DataFieldInfo::DataFieldInfo((DataFieldInfo *)local_298);
  local_360[0] = local_350;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_360,pcVar1,pcVar1 + name->_M_string_length);
  local_380[0] = local_370;
  pcVar1 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_380,pcVar1,pcVar1 + type->_M_string_length);
  std::__cxx11::string::_M_assign((string *)local_298);
  std::__cxx11::string::_M_assign(local_278);
  local_254 = (uint)(lSize != 1) + (uint)(kSize != 1) + (uint)(jSize != 1) + (uint)(iSize != 1);
  local_248 = kSize;
  local_244 = lSize;
  local_23c = iMinusHalo;
  local_240 = iPlusHalo;
  local_234 = jMinusHalo;
  local_238 = jPlusHalo;
  local_22c = kMinusHalo;
  local_230 = kPlusHalo;
  local_224 = lMinusHalo;
  local_228 = lPlusHalo;
  local_258 = bytesPerElement;
  local_250 = iSize;
  local_24c = jSize;
  if (local_380[0] != local_370) {
    operator_delete(local_380[0]);
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0]);
  }
  DataFieldInfo::DataFieldInfo(&local_340);
  other_00 = FieldsTable::Find(&this->fieldsTable_,name);
  DataFieldInfo::operator=(&local_340,other_00);
  __n = type->_M_string_length;
  if (__n == local_340.type_._M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((type->_M_dataplus)._M_p,local_340.type_._M_dataplus._M_p,__n);
      if (iVar2 != 0) goto LAB_0012989b;
    }
    if ((((local_340.bytesPerElement_ == bytesPerElement) && (local_340.iSize_ == iSize)) &&
        ((local_340.jSize_ == jSize && ((local_340.kSize_ == kSize && (local_340.lSize_ == lSize))))
        )) && ((local_340.iMinusHalo_ == iMinusHalo &&
               (((((local_340.iPlusHalo_ == iPlusHalo && (local_340.jMinusHalo_ == jMinusHalo)) &&
                  (local_340.jPlusHalo_ == jPlusHalo)) &&
                 ((local_340.kMinusHalo_ == kMinusHalo && (local_340.kPlusHalo_ == kPlusHalo)))) &&
                ((local_340.lMinusHalo_ == lMinusHalo && (local_340.lPlusHalo_ == lPlusHalo))))))))
    {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                   *)&local_340.metainfo_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340.type_._M_dataplus._M_p != &local_340.type_.field_2) {
        operator_delete(local_340.type_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340.name_._M_dataplus._M_p != &local_340.name_.field_2) {
        operator_delete(local_340.name_._M_dataplus._M_p);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
      ::~_Rb_tree(&local_220);
      if ((char *)local_278._0_8_ != local_268) {
        operator_delete((void *)local_278._0_8_);
      }
      if (local_298 != (undefined1  [8])local_288) {
        operator_delete((void *)local_298);
      }
      return false;
    }
  }
LAB_0012989b:
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error: field ",0xd);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," was already registered into ",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"serializer with different information",0x25);
  local_1c8._M_p = (pointer)&local_1b8;
  local_1d0 = &PTR__SerializationException_0013c730;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&local_1c8);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(pSVar4,(SerializationException *)&local_1d0);
  __cxa_throw(pSVar4,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

bool Serializer::RegisterField(const std::string& name, std::string type, int bytesPerElement,
            int iSize, int jSize, int kSize, int lSize,
            int iMinusHalo, int iPlusHalo, int jMinusHalo, int jPlusHalo,
            int kMinusHalo, int kPlusHalo, int lMinusHalo, int lPlusHalo
        )
{
    // Check that sizes are >= 1
    if (iSize < 1 || jSize < 1 || kSize < 1 || lSize < 1)
    {
        std::ostringstream errorstr;
        errorstr << "Error: field " << name << " is registered with sizes: "
            << iSize << "x" << jSize << "x" << kSize << "x" << lSize << "\n"
            << "Sizes must be larger than 0 for all dimensions\n";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    // Compute rank
    int rank = (iSize != 1 ? 1: 0) + (jSize != 1 ? 1: 0)
             + (kSize != 1 ? 1: 0) + (lSize != 1 ? 1: 0);

    // Create info object
    DataFieldInfo info;
    info.Init(name, type, bytesPerElement, rank,
              iSize, jSize, kSize, lSize,
              iMinusHalo, iPlusHalo, jMinusHalo, jPlusHalo,
              kMinusHalo, kPlusHalo, lMinusHalo, lPlusHalo);

    DataFieldInfo other;
    try
    {
        other = fieldsTable_.Find(name);
    }
    catch (SerializationException&)
    {
        // Field does not exist: register and exit
        fieldsTable_.RegisterField(info);
        return true;
    }

    // Field was alredy registered: check info
    if (   type != other.type()
        || bytesPerElement != other.bytesPerElement()
        || iSize != other.iSize()
        || jSize != other.jSize()
        || kSize != other.kSize()
        || lSize != other.lSize()
        || iMinusHalo != other.iMinusHaloSize()
        || iPlusHalo  != other.iPlusHaloSize()
        || jMinusHalo != other.jMinusHaloSize()
        || jPlusHalo  != other.jPlusHaloSize()
        || kMinusHalo != other.kMinusHaloSize()
        || kPlusHalo  != other.kPlusHaloSize()
        || lMinusHalo != other.lMinusHaloSize()
        || lPlusHalo  != other.lPlusHaloSize()
       )
    {
        std::ostringstream errorstr;
        errorstr << "Error: field " << name << " was already registered into "
            << "serializer with different information";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    return false;
}